

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::quantize
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short *out,btVector3 *point,int isMax
          )

{
  ushort uVar1;
  ushort uVar2;
  float fVar3;
  float fVar4;
  
  uVar2 = (ushort)isMax;
  fVar4 = (point->m_floats[0] - (this->m_worldAabbMin).m_floats[0]) * (this->m_quantize).m_floats[0]
  ;
  fVar3 = (point->m_floats[1] - (this->m_worldAabbMin).m_floats[1]) * (this->m_quantize).m_floats[1]
  ;
  uVar1 = uVar2;
  if (0.0 < fVar4) {
    uVar1 = this->m_handleSentinel;
    if (fVar4 < (float)uVar1) {
      uVar1 = (ushort)(int)fVar4;
    }
    uVar1 = uVar1 & this->m_bpHandleMask | uVar2;
  }
  fVar4 = (point->m_floats[2] - (this->m_worldAabbMin).m_floats[2]) * (this->m_quantize).m_floats[2]
  ;
  *out = uVar1;
  uVar1 = uVar2;
  if (0.0 < fVar3) {
    uVar1 = this->m_handleSentinel;
    if (fVar3 < (float)uVar1) {
      uVar1 = (ushort)(int)fVar3;
    }
    uVar1 = uVar1 & this->m_bpHandleMask | uVar2;
  }
  out[1] = uVar1;
  if (0.0 < fVar4) {
    uVar1 = this->m_handleSentinel;
    if (fVar4 < (float)uVar1) {
      uVar1 = (ushort)(int)fVar4;
    }
    uVar2 = uVar1 & this->m_bpHandleMask | uVar2;
  }
  out[2] = uVar2;
  return;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}